

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

char * printChar(int c)

{
  int iVar1;
  char *pcStack_10;
  int c_local;
  
  if (c == -1) {
    pcStack_10 = "EOF";
  }
  else {
    iVar1 = isprint(c);
    if (iVar1 == 0) {
      if (c == 9) {
        printChar::buf[2] = 't';
      }
      else if (c == 10) {
        printChar::buf[2] = 'n';
      }
      else {
        if (c != 0xd) {
          printChar::buf[0] = '0';
          printChar::buf[1] = 'x';
          snprintf(printChar::buf + 2,3,"%02hhX",(ulong)(c & 0xff));
          return printChar::buf;
        }
        printChar::buf[2] = 'r';
      }
      printChar::buf[0] = '\'';
      printChar::buf[1] = '\\';
      printChar::buf[3] = '\'';
      printChar::buf[4] = '\0';
      pcStack_10 = printChar::buf;
    }
    else {
      printChar::buf[0] = '\'';
      printChar::buf[1] = (char)c;
      printChar::buf[2] = '\'';
      printChar::buf[3] = '\0';
      pcStack_10 = printChar::buf;
    }
  }
  return pcStack_10;
}

Assistant:

char const *printChar(int c)
{
	// "'A'" + '\0': 4 bytes
	// "'\\n'" + '\0': 5 bytes
	// "0xFF" + '\0': 5 bytes
	static char buf[5];

	if (c == EOF)
		return "EOF";

	if (isprint(c)) {
		buf[0] = '\'';
		buf[1] = c;
		buf[2] = '\'';
		buf[3] = '\0';
		return buf;
	}

	switch (c) {
	case '\n':
		buf[2] = 'n';
		break;
	case '\r':
		buf[2] = 'r';
		break;
	case '\t':
		buf[2] = 't';
		break;

	default: // Print as hex
		buf[0] = '0';
		buf[1] = 'x';
		snprintf(&buf[2], 3, "%02hhX", (uint8_t)c); // includes the '\0'
		return buf;
	}
	buf[0] = '\'';
	buf[1] = '\\';
	buf[3] = '\'';
	buf[4] = '\0';
	return buf;
}